

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 *puVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 *puVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  undefined8 *puVar24;
  float *pfVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  int iVar32;
  int iVar33;
  float fVar34;
  undefined4 uVar35;
  Geometry *pGVar36;
  long lVar37;
  long lVar38;
  RTCFilterFunctionN p_Var39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined8 uVar45;
  int iVar46;
  AABBNodeMB4D *node1;
  ulong uVar47;
  size_t sVar48;
  uint uVar49;
  long lVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  bool bVar60;
  float fVar61;
  undefined1 auVar62 [16];
  float fVar63;
  float fVar69;
  float fVar71;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar64;
  float fVar70;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar68 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar84;
  float fVar85;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar86;
  float fVar87;
  uint uVar88;
  float fVar89;
  uint uVar90;
  float fVar91;
  uint uVar92;
  float fVar93;
  uint uVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fStack_ad0;
  float fStack_acc;
  undefined8 local_ac8;
  float local_aa8;
  float fStack_aa4;
  undefined1 local_a88 [16];
  undefined1 (*local_a78) [16];
  ulong local_a70;
  NodeRef *local_a68;
  Scene *scene;
  size_t local_a58;
  ulong local_a50;
  ulong local_a48;
  ulong local_a40;
  ulong local_a38;
  ulong local_a30;
  RTCFilterFunctionNArguments args;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined1 local_928 [16];
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  undefined1 local_8f8 [16];
  int local_8d8;
  int iStack_8d4;
  int iStack_8d0;
  int iStack_8cc;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  float local_898 [4];
  undefined1 local_888 [16];
  float local_878 [4];
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  local_a68 = stack + 1;
  stack[0] = root;
  fVar26 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar27 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar28 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar29 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar30 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar31 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_a70 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar58 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar59 = local_a70 ^ 0x10;
  iVar32 = (tray->tnear).field_0.i[k];
  iVar33 = (tray->tfar).field_0.i[k];
  local_a78 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar60 = true;
  uVar57 = local_a70;
  local_ac8 = k;
LAB_0025dd73:
  do {
    sVar48 = local_a68[-1].ptr;
    local_a68 = local_a68 + -1;
    while ((sVar48 & 8) == 0) {
      uVar47 = sVar48 & 0xfffffffffffffff0;
      fVar61 = *(float *)(ray + k * 4 + 0x70);
      pfVar25 = (float *)(uVar47 + 0x80 + uVar57);
      pfVar23 = (float *)(uVar47 + 0x20 + uVar57);
      auVar78._0_4_ = ((*pfVar25 * fVar61 + *pfVar23) - fVar26) * fVar29;
      auVar78._4_4_ = ((pfVar25[1] * fVar61 + pfVar23[1]) - fVar26) * fVar29;
      auVar78._8_4_ = ((pfVar25[2] * fVar61 + pfVar23[2]) - fVar26) * fVar29;
      auVar78._12_4_ = ((pfVar25[3] * fVar61 + pfVar23[3]) - fVar26) * fVar29;
      auVar76._4_4_ = iVar32;
      auVar76._0_4_ = iVar32;
      auVar76._8_4_ = iVar32;
      auVar76._12_4_ = iVar32;
      auVar65 = maxps(auVar76,auVar78);
      pfVar25 = (float *)(uVar47 + 0x80 + uVar51);
      pfVar23 = (float *)(uVar47 + 0x20 + uVar51);
      auVar75._0_4_ = ((*pfVar25 * fVar61 + *pfVar23) - fVar27) * fVar30;
      auVar75._4_4_ = ((pfVar25[1] * fVar61 + pfVar23[1]) - fVar27) * fVar30;
      auVar75._8_4_ = ((pfVar25[2] * fVar61 + pfVar23[2]) - fVar27) * fVar30;
      auVar75._12_4_ = ((pfVar25[3] * fVar61 + pfVar23[3]) - fVar27) * fVar30;
      pfVar25 = (float *)(uVar47 + 0x80 + uVar58);
      pfVar23 = (float *)(uVar47 + 0x20 + uVar58);
      auVar81._0_4_ = ((*pfVar25 * fVar61 + *pfVar23) - fVar28) * fVar31;
      auVar81._4_4_ = ((pfVar25[1] * fVar61 + pfVar23[1]) - fVar28) * fVar31;
      auVar81._8_4_ = ((pfVar25[2] * fVar61 + pfVar23[2]) - fVar28) * fVar31;
      auVar81._12_4_ = ((pfVar25[3] * fVar61 + pfVar23[3]) - fVar28) * fVar31;
      auVar76 = maxps(auVar75,auVar81);
      auVar76 = maxps(auVar65,auVar76);
      pfVar25 = (float *)(uVar47 + 0x80 + uVar59);
      pfVar23 = (float *)(uVar47 + 0x20 + uVar59);
      auVar82._0_4_ = ((*pfVar25 * fVar61 + *pfVar23) - fVar26) * fVar29;
      auVar82._4_4_ = ((pfVar25[1] * fVar61 + pfVar23[1]) - fVar26) * fVar29;
      auVar82._8_4_ = ((pfVar25[2] * fVar61 + pfVar23[2]) - fVar26) * fVar29;
      auVar82._12_4_ = ((pfVar25[3] * fVar61 + pfVar23[3]) - fVar26) * fVar29;
      auVar77._4_4_ = iVar33;
      auVar77._0_4_ = iVar33;
      auVar77._8_4_ = iVar33;
      auVar77._12_4_ = iVar33;
      auVar78 = minps(auVar77,auVar82);
      pfVar25 = (float *)(uVar47 + 0x80 + (uVar51 ^ 0x10));
      pfVar23 = (float *)(uVar47 + 0x20 + (uVar51 ^ 0x10));
      auVar83._0_4_ = ((*pfVar25 * fVar61 + *pfVar23) - fVar27) * fVar30;
      auVar83._4_4_ = ((pfVar25[1] * fVar61 + pfVar23[1]) - fVar27) * fVar30;
      auVar83._8_4_ = ((pfVar25[2] * fVar61 + pfVar23[2]) - fVar27) * fVar30;
      auVar83._12_4_ = ((pfVar25[3] * fVar61 + pfVar23[3]) - fVar27) * fVar30;
      pfVar25 = (float *)(uVar47 + 0x80 + (uVar58 ^ 0x10));
      pfVar23 = (float *)(uVar47 + 0x20 + (uVar58 ^ 0x10));
      auVar65._4_4_ = ((pfVar25[1] * fVar61 + pfVar23[1]) - fVar28) * fVar31;
      auVar65._0_4_ = ((*pfVar25 * fVar61 + *pfVar23) - fVar28) * fVar31;
      auVar65._8_4_ = ((pfVar25[2] * fVar61 + pfVar23[2]) - fVar28) * fVar31;
      auVar65._12_4_ = ((pfVar25[3] * fVar61 + pfVar23[3]) - fVar28) * fVar31;
      auVar65 = minps(auVar83,auVar65);
      auVar65 = minps(auVar78,auVar65);
      bVar40 = auVar76._0_4_ <= auVar65._0_4_;
      bVar41 = auVar76._4_4_ <= auVar65._4_4_;
      bVar42 = auVar76._8_4_ <= auVar65._8_4_;
      bVar43 = auVar76._12_4_ <= auVar65._12_4_;
      if (((uint)sVar48 & 7) == 6) {
        bVar40 = (fVar61 < *(float *)(uVar47 + 0xf0) && *(float *)(uVar47 + 0xe0) <= fVar61) &&
                 bVar40;
        bVar41 = (fVar61 < *(float *)(uVar47 + 0xf4) && *(float *)(uVar47 + 0xe4) <= fVar61) &&
                 bVar41;
        bVar42 = (fVar61 < *(float *)(uVar47 + 0xf8) && *(float *)(uVar47 + 0xe8) <= fVar61) &&
                 bVar42;
        bVar43 = (fVar61 < *(float *)(uVar47 + 0xfc) && *(float *)(uVar47 + 0xec) <= fVar61) &&
                 bVar43;
      }
      auVar66._0_4_ = (uint)bVar40 * -0x80000000;
      auVar66._4_4_ = (uint)bVar41 * -0x80000000;
      auVar66._8_4_ = (uint)bVar42 * -0x80000000;
      auVar66._12_4_ = (uint)bVar43 * -0x80000000;
      uVar49 = movmskps((int)root.ptr,auVar66);
      root.ptr = (size_t)uVar49;
      if (uVar49 == 0) {
        bVar60 = local_a68 != stack;
        if (!bVar60) {
          return bVar60;
        }
        goto LAB_0025dd73;
      }
      lVar50 = 0;
      if ((byte)uVar49 != 0) {
        for (; ((byte)uVar49 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
        }
      }
      sVar48 = *(size_t *)(uVar47 + lVar50 * 8);
      uVar49 = (uVar49 & 0xff) - 1 & uVar49 & 0xff;
      root.ptr = (size_t)uVar49;
      if (uVar49 != 0) {
        local_a68->ptr = sVar48;
        local_a68 = local_a68 + 1;
        lVar50 = 0;
        if (root.ptr != 0) {
          for (; (uVar49 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
          }
        }
        sVar48 = *(size_t *)(uVar47 + lVar50 * 8);
        uVar49 = uVar49 - 1 & uVar49;
        uVar52 = (ulong)uVar49;
        if (uVar49 != 0) {
          do {
            local_a68->ptr = sVar48;
            local_a68 = local_a68 + 1;
            root.ptr = 0;
            if (uVar52 != 0) {
              for (; (uVar52 >> root.ptr & 1) == 0; root.ptr = root.ptr + 1) {
              }
            }
            sVar48 = *(size_t *)(uVar47 + root.ptr * 8);
            uVar52 = uVar52 & uVar52 - 1;
          } while (uVar52 != 0);
        }
      }
    }
    local_a58 = (ulong)((uint)sVar48 & 0xf) - 8;
    if (local_a58 != 0) {
      uVar57 = sVar48 & 0xfffffffffffffff0;
      root.ptr = 0;
      sVar48 = k;
      do {
        k = local_ac8;
        lVar50 = root.ptr * 0x50;
        scene = context->scene;
        pGVar36 = (scene->geometries).items[*(uint *)(uVar57 + 0x30 + lVar50)].ptr;
        fVar61 = (pGVar36->time_range).lower;
        fVar95 = ((*(float *)(ray + sVar48 * 4 + 0x70) - fVar61) /
                 ((pGVar36->time_range).upper - fVar61)) * pGVar36->fnumTimeSegments;
        auVar67 = roundss(ZEXT416((uint)fVar61),ZEXT416((uint)fVar95),9);
        fVar61 = pGVar36->fnumTimeSegments + -1.0;
        if (fVar61 <= auVar67._0_4_) {
          auVar67._0_4_ = fVar61;
        }
        fVar61 = 0.0;
        if (0.0 <= auVar67._0_4_) {
          fVar61 = auVar67._0_4_;
        }
        uVar56 = (ulong)*(uint *)(uVar57 + 4 + lVar50);
        lVar37 = *(long *)(*(long *)&pGVar36[2].numPrimitives + (long)(int)fVar61 * 0x38);
        lVar38 = *(long *)(*(long *)&pGVar36[2].numPrimitives + 0x38 + (long)(int)fVar61 * 0x38);
        pfVar23 = (float *)(lVar37 + (ulong)*(uint *)(uVar57 + lVar50) * 4);
        uVar47 = (ulong)*(uint *)(uVar57 + 0x10 + lVar50);
        pfVar25 = (float *)(lVar37 + uVar47 * 4);
        uVar52 = (ulong)*(uint *)(uVar57 + 0x20 + lVar50);
        puVar1 = (undefined8 *)(lVar37 + uVar52 * 4);
        uVar45 = *puVar1;
        pfVar2 = (float *)(lVar37 + uVar56 * 4);
        local_a38 = (ulong)*(uint *)(uVar57 + 0x14 + lVar50);
        pfVar3 = (float *)(lVar37 + local_a38 * 4);
        uVar53 = (ulong)*(uint *)(uVar57 + 0x24 + lVar50);
        pfVar4 = (float *)(lVar37 + uVar53 * 4);
        uVar54 = (ulong)*(uint *)(uVar57 + 8 + lVar50);
        puVar5 = (undefined4 *)(lVar37 + uVar54 * 4);
        local_a50 = (ulong)*(uint *)(uVar57 + 0x18 + lVar50);
        pfVar6 = (float *)(lVar37 + local_a50 * 4);
        local_a30 = (ulong)*(uint *)(uVar57 + 0x28 + lVar50);
        pfVar7 = (float *)(lVar37 + local_a30 * 4);
        uVar55 = (ulong)*(uint *)(uVar57 + 0xc + lVar50);
        puVar8 = (undefined4 *)(lVar37 + uVar55 * 4);
        local_a48 = (ulong)*(uint *)(uVar57 + 0x1c + lVar50);
        pfVar9 = (float *)(lVar37 + local_a48 * 4);
        uVar49 = *(uint *)(uVar57 + 0x2c + lVar50);
        local_a40 = (ulong)uVar49;
        pfVar10 = (float *)(lVar37 + local_a40 * 4);
        pfVar11 = (float *)(lVar38 + (ulong)*(uint *)(uVar57 + lVar50) * 4);
        pfVar12 = (float *)(lVar38 + uVar47 * 4);
        fVar95 = fVar95 - fVar61;
        pfVar13 = (float *)(lVar38 + uVar56 * 4);
        local_ac8 = CONCAT44(*puVar8,*puVar5);
        pfVar14 = (float *)(lVar38 + uVar54 * 4);
        local_aa8 = (float)uVar45;
        fStack_aa4 = (float)((ulong)uVar45 >> 0x20);
        pfVar15 = (float *)(lVar38 + uVar55 * 4);
        pfVar16 = (float *)(lVar38 + local_a50 * 4);
        pfVar17 = (float *)(lVar38 + local_a38 * 4);
        pfVar18 = (float *)(lVar38 + local_a48 * 4);
        pfVar19 = (float *)(lVar38 + uVar52 * 4);
        pfVar20 = (float *)(lVar38 + local_a30 * 4);
        pfVar21 = (float *)(lVar38 + uVar53 * 4);
        pfVar22 = (float *)(lVar38 + local_a40 * 4);
        fVar61 = 1.0 - fVar95;
        fVar96 = *pfVar23 * fVar61 + *pfVar11 * fVar95;
        fVar98 = *pfVar2 * fVar61 + *pfVar13 * fVar95;
        fVar100 = fStack_ad0 * fVar61 + *pfVar14 * fVar95;
        fVar102 = fStack_acc * fVar61 + *pfVar15 * fVar95;
        fVar63 = pfVar23[1] * fVar61 + pfVar11[1] * fVar95;
        fVar69 = pfVar2[1] * fVar61 + pfVar13[1] * fVar95;
        fVar71 = (float)puVar5[1] * fVar61 + pfVar14[1] * fVar95;
        fVar73 = (float)puVar8[1] * fVar61 + pfVar15[1] * fVar95;
        fVar97 = pfVar23[2] * fVar61 + pfVar11[2] * fVar95;
        fVar99 = pfVar2[2] * fVar61 + pfVar13[2] * fVar95;
        fVar101 = (float)puVar5[2] * fVar61 + pfVar14[2] * fVar95;
        fVar103 = (float)puVar8[2] * fVar61 + pfVar15[2] * fVar95;
        puVar24 = (undefined8 *)(uVar57 + 0x30 + lVar50);
        local_938 = *puVar24;
        uStack_930 = puVar24[1];
        puVar24 = (undefined8 *)(uVar57 + 0x40 + lVar50);
        local_948 = *puVar24;
        uStack_940 = puVar24[1];
        fVar80 = fVar96 - (*pfVar25 * fVar61 + *pfVar12 * fVar95);
        fVar84 = fVar98 - (*pfVar3 * fVar61 + *pfVar17 * fVar95);
        fVar85 = fVar100 - (*pfVar6 * fVar61 + *pfVar16 * fVar95);
        fVar86 = fVar102 - (*pfVar9 * fVar61 + *pfVar18 * fVar95);
        fVar113 = fVar63 - (pfVar25[1] * fVar61 + pfVar12[1] * fVar95);
        fVar115 = fVar69 - (pfVar3[1] * fVar61 + pfVar17[1] * fVar95);
        fVar117 = fVar71 - (pfVar6[1] * fVar61 + pfVar16[1] * fVar95);
        fVar119 = fVar73 - (pfVar9[1] * fVar61 + pfVar18[1] * fVar95);
        fVar121 = fVar97 - (pfVar25[2] * fVar61 + pfVar12[2] * fVar95);
        fVar122 = fVar99 - (pfVar3[2] * fVar61 + pfVar17[2] * fVar95);
        fVar123 = fVar101 - (pfVar6[2] * fVar61 + pfVar16[2] * fVar95);
        fVar124 = fVar103 - (pfVar9[2] * fVar61 + pfVar18[2] * fVar95);
        fVar64 = (local_aa8 * fVar61 + *pfVar19 * fVar95) - fVar96;
        fVar70 = (*pfVar4 * fVar61 + *pfVar21 * fVar95) - fVar98;
        fVar72 = (*pfVar7 * fVar61 + *pfVar20 * fVar95) - fVar100;
        fVar74 = (*pfVar10 * fVar61 + *pfVar22 * fVar95) - fVar102;
        fVar87 = (fStack_aa4 * fVar61 + pfVar19[1] * fVar95) - fVar63;
        fVar89 = (pfVar4[1] * fVar61 + pfVar21[1] * fVar95) - fVar69;
        fVar91 = (pfVar7[1] * fVar61 + pfVar20[1] * fVar95) - fVar71;
        fVar93 = (pfVar10[1] * fVar61 + pfVar22[1] * fVar95) - fVar73;
        fVar105 = (fVar61 * (float)puVar1[1] + fVar95 * pfVar19[2]) - fVar97;
        fVar106 = (fVar61 * pfVar4[2] + fVar95 * pfVar21[2]) - fVar99;
        fVar107 = (fVar61 * pfVar7[2] + fVar95 * pfVar20[2]) - fVar101;
        fVar108 = (fVar61 * pfVar10[2] + fVar95 * pfVar22[2]) - fVar103;
        local_898[0] = fVar121 * fVar87 - fVar113 * fVar105;
        local_898[1] = fVar122 * fVar89 - fVar115 * fVar106;
        local_898[2] = fVar123 * fVar91 - fVar117 * fVar107;
        local_898[3] = fVar124 * fVar93 - fVar119 * fVar108;
        fVar61 = *(float *)(ray + k * 4);
        fVar95 = *(float *)(ray + k * 4 + 0x10);
        fVar112 = *(float *)(ray + k * 4 + 0x40);
        fVar34 = *(float *)(ray + k * 4 + 0x50);
        fVar96 = fVar96 - fVar61;
        fVar98 = fVar98 - fVar61;
        fStack_ad0 = fVar100 - fVar61;
        fStack_acc = fVar102 - fVar61;
        fVar63 = fVar63 - fVar95;
        fVar69 = fVar69 - fVar95;
        fVar71 = fVar71 - fVar95;
        fVar73 = fVar73 - fVar95;
        fVar125 = fVar96 * fVar34 - fVar63 * fVar112;
        fVar126 = fVar98 * fVar34 - fVar69 * fVar112;
        fVar127 = fStack_ad0 * fVar34 - fVar71 * fVar112;
        fVar128 = fStack_acc * fVar34 - fVar73 * fVar112;
        local_888._0_4_ = fVar80 * fVar105 - fVar121 * fVar64;
        local_888._4_4_ = fVar84 * fVar106 - fVar122 * fVar70;
        local_888._8_4_ = fVar85 * fVar107 - fVar123 * fVar72;
        local_888._12_4_ = fVar86 * fVar108 - fVar124 * fVar74;
        fVar61 = *(float *)(ray + k * 4 + 0x20);
        fVar95 = *(float *)(ray + k * 4 + 0x60);
        fVar97 = fVar97 - fVar61;
        fVar99 = fVar99 - fVar61;
        fVar101 = fVar101 - fVar61;
        fVar103 = fVar103 - fVar61;
        fVar61 = fVar97 * fVar112 - fVar96 * fVar95;
        fVar100 = fVar99 * fVar112 - fVar98 * fVar95;
        fVar102 = fVar101 * fVar112 - fStack_ad0 * fVar95;
        fVar104 = fVar103 * fVar112 - fStack_acc * fVar95;
        local_878[0] = fVar113 * fVar64 - fVar80 * fVar87;
        local_878[1] = fVar115 * fVar70 - fVar84 * fVar89;
        local_878[2] = fVar117 * fVar72 - fVar85 * fVar91;
        local_878[3] = fVar119 * fVar74 - fVar86 * fVar93;
        fVar114 = fVar63 * fVar95 - fVar97 * fVar34;
        fVar116 = fVar69 * fVar95 - fVar99 * fVar34;
        fVar118 = fVar71 * fVar95 - fVar101 * fVar34;
        fVar120 = fVar73 * fVar95 - fVar103 * fVar34;
        fVar109 = fVar112 * local_898[0] + fVar34 * local_888._0_4_ + fVar95 * local_878[0];
        fVar110 = fVar112 * local_898[1] + fVar34 * local_888._4_4_ + fVar95 * local_878[1];
        fVar111 = fVar112 * local_898[2] + fVar34 * local_888._8_4_ + fVar95 * local_878[2];
        fVar112 = fVar112 * local_898[3] + fVar34 * local_888._12_4_ + fVar95 * local_878[3];
        uVar88 = (uint)fVar109 & 0x80000000;
        uVar90 = (uint)fVar110 & 0x80000000;
        uVar92 = (uint)fVar111 & 0x80000000;
        uVar94 = (uint)fVar112 & 0x80000000;
        local_928._0_4_ =
             (float)((uint)(fVar64 * fVar114 + fVar87 * fVar61 + fVar105 * fVar125) ^ uVar88);
        local_928._4_4_ =
             (float)((uint)(fVar70 * fVar116 + fVar89 * fVar100 + fVar106 * fVar126) ^ uVar90);
        local_928._8_4_ =
             (float)((uint)(fVar72 * fVar118 + fVar91 * fVar102 + fVar107 * fVar127) ^ uVar92);
        local_928._12_4_ =
             (float)((uint)(fVar74 * fVar120 + fVar93 * fVar104 + fVar108 * fVar128) ^ uVar94);
        local_918 = (float)((uint)(fVar114 * fVar80 + fVar61 * fVar113 + fVar125 * fVar121) ^ uVar88
                           );
        fStack_914 = (float)((uint)(fVar116 * fVar84 + fVar100 * fVar115 + fVar126 * fVar122) ^
                            uVar90);
        fStack_910 = (float)((uint)(fVar118 * fVar85 + fVar102 * fVar117 + fVar127 * fVar123) ^
                            uVar92);
        fStack_90c = (float)((uint)(fVar120 * fVar86 + fVar104 * fVar119 + fVar128 * fVar124) ^
                            uVar94);
        fVar61 = ABS(fVar109);
        fVar95 = ABS(fVar110);
        local_8f8._0_8_ = CONCAT44(fVar110,fVar109) & 0x7fffffff7fffffff;
        local_8f8._8_4_ = ABS(fVar111);
        local_8f8._12_4_ = ABS(fVar112);
        bVar41 = ((0.0 <= local_918 && 0.0 <= local_928._0_4_) && fVar109 != 0.0) &&
                 local_928._0_4_ + local_918 <= fVar61;
        auVar79._0_4_ = -(uint)bVar41;
        bVar43 = ((0.0 <= fStack_914 && 0.0 <= local_928._4_4_) && fVar110 != 0.0) &&
                 local_928._4_4_ + fStack_914 <= fVar95;
        auVar79._4_4_ = -(uint)bVar43;
        bVar42 = ((0.0 <= fStack_910 && 0.0 <= local_928._8_4_) && fVar111 != 0.0) &&
                 local_928._8_4_ + fStack_910 <= local_8f8._8_4_;
        auVar79._8_4_ = -(uint)bVar42;
        bVar40 = ((0.0 <= fStack_90c && 0.0 <= local_928._12_4_) && fVar112 != 0.0) &&
                 local_928._12_4_ + fStack_90c <= local_8f8._12_4_;
        auVar79._12_4_ = -(uint)bVar40;
        iVar46 = movmskps(uVar49,auVar79);
        if (iVar46 != 0) {
          local_908 = (float)(uVar88 ^ (uint)(fVar96 * local_898[0] +
                                             fVar63 * local_888._0_4_ + fVar97 * local_878[0]));
          fStack_904 = (float)(uVar90 ^ (uint)(fVar98 * local_898[1] +
                                              fVar69 * local_888._4_4_ + fVar99 * local_878[1]));
          fStack_900 = (float)(uVar92 ^ (uint)(fStack_ad0 * local_898[2] +
                                              fVar71 * local_888._8_4_ + fVar101 * local_878[2]));
          fStack_8fc = (float)(uVar94 ^ (uint)(fStack_acc * local_898[3] +
                                              fVar73 * local_888._12_4_ + fVar103 * local_878[3]));
          fVar112 = *(float *)(ray + k * 4 + 0x30);
          fVar34 = *(float *)(ray + k * 4 + 0x80);
          local_8d8 = -(uint)((local_908 <= fVar34 * fVar61 && fVar112 * fVar61 < local_908) &&
                             bVar41);
          iStack_8d4 = -(uint)((fStack_904 <= fVar34 * fVar95 && fVar112 * fVar95 < fStack_904) &&
                              bVar43);
          iStack_8d0 = -(uint)((fStack_900 <= fVar34 * local_8f8._8_4_ &&
                               fVar112 * local_8f8._8_4_ < fStack_900) && bVar42);
          iStack_8cc = -(uint)((fStack_8fc <= fVar34 * local_8f8._12_4_ &&
                               fVar112 * local_8f8._12_4_ < fStack_8fc) && bVar40);
          auVar44._4_4_ = iStack_8d4;
          auVar44._0_4_ = local_8d8;
          auVar44._8_4_ = iStack_8d0;
          auVar44._12_4_ = iStack_8cc;
          uVar49 = movmskps(iVar46,auVar44);
          if (uVar49 != 0) {
            auVar65 = rcpps(local_888,local_8f8);
            fVar112 = auVar65._0_4_;
            fVar63 = auVar65._4_4_;
            fVar64 = auVar65._8_4_;
            fVar69 = auVar65._12_4_;
            fVar112 = (1.0 - fVar61 * fVar112) * fVar112 + fVar112;
            fVar63 = (1.0 - fVar95 * fVar63) * fVar63 + fVar63;
            fVar64 = (1.0 - local_8f8._8_4_ * fVar64) * fVar64 + fVar64;
            fVar69 = (1.0 - local_8f8._12_4_ * fVar69) * fVar69 + fVar69;
            local_8a8[0] = local_908 * fVar112;
            local_8a8[1] = fStack_904 * fVar63;
            local_8a8[2] = fStack_900 * fVar64;
            local_8a8[3] = fStack_8fc * fVar69;
            local_8c8._0_4_ = local_928._0_4_ * fVar112;
            local_8c8._4_4_ = local_928._4_4_ * fVar63;
            local_8c8._8_4_ = local_928._8_4_ * fVar64;
            local_8c8._12_4_ = local_928._12_4_ * fVar69;
            local_8b8._0_4_ = fVar112 * local_918;
            local_8b8._4_4_ = fVar63 * fStack_914;
            local_8b8._8_4_ = fVar64 * fStack_910;
            local_8b8._12_4_ = fVar69 * fStack_90c;
            uVar47 = (ulong)(uVar49 & 0xff);
            do {
              uVar52 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                }
              }
              local_808 = *(uint *)((long)&local_938 + uVar52 * 4);
              pGVar36 = (scene->geometries).items[local_808].ptr;
              if ((pGVar36->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar36->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0025e848:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar60;
                }
                local_838 = *(undefined4 *)(local_8c8 + uVar52 * 4);
                fVar61 = local_8a8[uVar52 - 4];
                *(float *)(ray + k * 4 + 0x80) = local_8a8[uVar52];
                args.context = context->user;
                uVar35 = *(undefined4 *)((long)&local_948 + uVar52 * 4);
                local_818._4_4_ = uVar35;
                local_818._0_4_ = uVar35;
                local_818._8_4_ = uVar35;
                local_818._12_4_ = uVar35;
                local_828._4_4_ = fVar61;
                local_828._0_4_ = fVar61;
                local_828._8_4_ = fVar61;
                local_828._12_4_ = fVar61;
                local_868 = local_898[uVar52];
                local_858 = local_878[uVar52 - 4];
                local_848 = local_878[uVar52];
                fStack_864 = local_868;
                fStack_860 = local_868;
                fStack_85c = local_868;
                fStack_854 = local_858;
                fStack_850 = local_858;
                fStack_84c = local_858;
                fStack_844 = local_848;
                fStack_840 = local_848;
                fStack_83c = local_848;
                uStack_834 = local_838;
                uStack_830 = local_838;
                uStack_82c = local_838;
                uStack_804 = local_808;
                uStack_800 = local_808;
                uStack_7fc = local_808;
                local_7f8 = (args.context)->instID[0];
                uStack_7f4 = local_7f8;
                uStack_7f0 = local_7f8;
                uStack_7ec = local_7f8;
                local_7e8 = (args.context)->instPrimID[0];
                uStack_7e4 = local_7e8;
                uStack_7e0 = local_7e8;
                uStack_7dc = local_7e8;
                local_a88 = *local_a78;
                args.valid = (int *)local_a88;
                args.geometryUserPtr = pGVar36->userPtr;
                args.hit = (RTCHitN *)&local_868;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar36->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar36->occlusionFilterN)(&args);
                }
                if (local_a88 == (undefined1  [16])0x0) {
                  auVar68._8_4_ = 0xffffffff;
                  auVar68._0_8_ = 0xffffffffffffffff;
                  auVar68._12_4_ = 0xffffffff;
                  auVar68 = auVar68 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var39 = context->args->filter;
                  if ((p_Var39 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar36->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var39)(&args);
                  }
                  auVar62._0_4_ = -(uint)(local_a88._0_4_ == 0);
                  auVar62._4_4_ = -(uint)(local_a88._4_4_ == 0);
                  auVar62._8_4_ = -(uint)(local_a88._8_4_ == 0);
                  auVar62._12_4_ = -(uint)(local_a88._12_4_ == 0);
                  auVar68 = auVar62 ^ _DAT_01f7ae20;
                  auVar65 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar62);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar65;
                }
                k = local_ac8;
                if ((_DAT_01f7bb20 & auVar68) != (undefined1  [16])0x0) goto LAB_0025e848;
                *(float *)(ray + local_ac8 * 4 + 0x80) = fVar34;
                fStack_ad0 = 0.0;
                fStack_acc = 0.0;
              }
              uVar47 = uVar47 ^ 1L << (uVar52 & 0x3f);
            } while (uVar47 != 0);
          }
        }
        root.ptr = root.ptr + 1;
        sVar48 = k;
      } while (root.ptr != local_a58);
    }
    bVar60 = local_a68 != stack;
    uVar57 = local_a70;
    if (!bVar60) {
      return bVar60;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }